

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
gulps::gulps_async_file_output::gulps_async_file_output(gulps_async_file_output *this,string *name)

{
  gulps_async_file_output *local_40;
  code *local_38;
  undefined8 local_30;
  string *local_18;
  string *name_local;
  gulps_async_file_output *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  gulps_file_output::gulps_file_output(&this->super_gulps_file_output,name);
  (this->super_gulps_file_output).super_gulps_output._vptr_gulps_output =
       (_func_int **)&PTR__gulps_async_file_output_00188b90;
  thdq<gulps::message>::thdq(&this->msg_q);
  local_38 = output_main;
  local_30 = 0;
  local_40 = this;
  std::thread::
  thread<void(gulps::gulps_async_file_output::*)(),gulps::gulps_async_file_output*,void>
            (&this->thd,(type *)&local_38,&local_40);
  return;
}

Assistant:

gulps_async_file_output(const std::string& name) : 
			gulps_file_output(name), thd(&gulps_async_file_output::output_main, this)
		{
		}